

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_range_vector.hpp
# Opt level: O2

vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
* __thiscall
burst::make_range_vector_t::operator()
          (vector<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>,_std::allocator<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>_>
           *__return_storage_ptr__,make_range_vector_t *this,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
          *collections,
          iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>
          *collections_1)

{
  initializer_list<boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>
  values;
  istream_type *local_48;
  int local_40;
  undefined1 local_3c;
  istream_type *local_38;
  int local_30;
  undefined1 local_2c;
  istream_type *local_28;
  int local_20;
  undefined1 local_1c;
  istream_type *local_18;
  int local_10;
  undefined1 local_c;
  
  local_48 = (collections->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_stream;
  local_40 = (collections->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_value;
  local_3c = (collections->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_ok;
  local_38 = (collections->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_End._M_stream;
  local_30 = (collections->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_End._M_value;
  local_2c = (collections->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_End._M_ok;
  local_28 = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_stream;
  local_20 = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_value;
  local_1c = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_Begin._M_ok;
  local_18 = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_End._M_stream;
  local_10 = (collections_1->
             super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
             ).m_End._M_value;
  local_c = (collections_1->
            super_iterator_range_base<std::istream_iterator<int,_char,_std::char_traits<char>,_long>,_boost::iterators::incrementable_traversal_tag>
            ).m_End._M_ok;
  values._M_len._1_7_ = (undefined7)((ulong)collections_1 >> 8);
  values._M_len._0_1_ = (bool)local_c;
  values._M_array = (iterator)0x2;
  make_sequence_container<std::vector,_boost::iterator_range<std::istream_iterator<int,_char,_std::char_traits<char>,_long>_>_>
            (__return_storage_ptr__,(burst *)&local_48,values);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Collections & ... collections) const
        {
            return make_vector({boost::make_iterator_range(collections)...});
        }